

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O3

int SUNMatMatvec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  N_Vector_ID NVar6;
  int iVar7;
  realtype *prVar8;
  realtype *__s;
  long lVar9;
  ulong uVar10;
  
  NVar6 = N_VGetVectorID(x);
  if (((NVar6 != SUNDIALS_NVEC_SERIAL) && (NVar6 = N_VGetVectorID(x), NVar6 != SUNDIALS_NVEC_OPENMP)
      ) && (NVar6 = N_VGetVectorID(x), NVar6 != SUNDIALS_NVEC_PTHREADS)) {
    return -0x2bd;
  }
  prVar8 = N_VGetArrayPointer(x);
  __s = N_VGetArrayPointer(y);
  iVar7 = -0x2be;
  if (prVar8 != __s && (__s != (realtype *)0x0 && prVar8 != (realtype *)0x0)) {
    puVar3 = (uint *)A->content;
    uVar1 = *puVar3;
    if (0 < (int)uVar1) {
      memset(__s,0,(ulong)uVar1 * 8);
    }
    uVar2 = puVar3[1];
    if (0 < (long)(int)uVar2) {
      lVar4 = *(long *)(puVar3 + 6);
      lVar9 = 0;
      do {
        if (0 < (int)uVar1) {
          lVar5 = *(long *)(lVar4 + lVar9 * 8);
          uVar10 = 0;
          do {
            __s[uVar10] = *(double *)(lVar5 + uVar10 * 8) * prVar8[lVar9] + __s[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar1 != uVar10);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != (int)uVar2);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int SUNMatMatvec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  realtype *col_j, *xd, *yd;

  /* Verify that A, x and y are compatible */
  if (!SMCompatible2_Dense(A, x, y))
    return SUNMAT_ILL_INPUT;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return SUNMAT_MEM_FAIL;

  /* Perform operation */
  for (i=0; i<SM_ROWS_D(A); i++)
    yd[i] = ZERO;
  for(j=0; j<SM_COLUMNS_D(A); j++) {
    col_j = SM_COLUMN_D(A,j);
    for (i=0; i<SM_ROWS_D(A); i++)
      yd[i] += col_j[i]*xd[j];
  }
  return SUNMAT_SUCCESS;
}